

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_client_request.cxx
# Opt level: O0

ptr<resp_msg> __thiscall
nuraft::raft_server::handle_cli_req
          (raft_server *this,req_msg *req,req_ext_params *ext_params,uint64_t timestamp_us)

{
  int32_t my_id;
  bool bVar1;
  srv_role sVar2;
  int iVar3;
  __int_type_conflict leader_id;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  element_type *peVar7;
  element_type *peVar8;
  undefined4 extraout_var;
  debugging_options *pdVar9;
  atomic<unsigned_long> *paVar10;
  element_type *this_00;
  element_type *peVar11;
  element_type *peVar12;
  element_type *peVar13;
  element_type *peVar14;
  long in_RCX;
  char *__addr_len;
  req_msg *in_RDX;
  sockaddr *__addr;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  element_type *in_RDI;
  uint64_t in_R8;
  ptr<resp_msg> pVar15;
  iterator entry;
  lock_guard<std::mutex> guard;
  ptr<commit_ret_elem> elem;
  size_t sleep_us;
  CbReturnCode rc;
  Param param;
  req_ext_cb_params cb_params;
  ptr<buffer> buf;
  ulong next_slot;
  size_t i;
  size_t num_entries;
  vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
  *entries;
  ptr<raft_params> params;
  ulong cur_term;
  ulong resp_idx;
  ptr<buffer> ret_value;
  ulong last_idx;
  ptr<resp_msg> resp;
  memory_order __b;
  log_entry *in_stack_fffffffffffffbe8;
  element_type *in_stack_fffffffffffffbf0;
  _Bind<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>_(nuraft::raft_server::*(nuraft::raft_server_*,_std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>))(std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>)>
  *in_stack_fffffffffffffbf8;
  function<std::shared_ptr<nuraft::resp_msg>_(std::shared_ptr<nuraft::resp_msg>)>
  *in_stack_fffffffffffffc00;
  raft_server *in_stack_fffffffffffffc08;
  ulong uVar16;
  undefined4 in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc14;
  undefined4 in_stack_fffffffffffffc30;
  return_method_type rVar17;
  undefined4 in_stack_fffffffffffffc34;
  ptr<log_entry> *in_stack_fffffffffffffc38;
  raft_server *in_stack_fffffffffffffc40;
  string local_2e0 [40];
  code *local_2b8;
  undefined8 local_2b0;
  size_t in_stack_fffffffffffffd70;
  ulong in_stack_fffffffffffffd78;
  raft_server *in_stack_fffffffffffffd80;
  string local_1b8 [32];
  _Self local_198;
  _Self local_190 [2];
  __shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2> local_180 [2];
  __int_type local_160;
  ReturnCode local_154;
  Param local_150;
  req_ext_cb_params local_138;
  ext_op_params local_120;
  undefined1 local_110 [16];
  ptr<buffer> local_100;
  string local_f0 [32];
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
  *local_b8;
  undefined4 local_b0;
  undefined4 local_ac;
  ulong local_78;
  undefined8 local_70;
  __shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> local_68;
  ulong local_58 [3];
  uint64_t local_40;
  long local_38;
  req_msg *local_30;
  __int_type local_18;
  memory_order local_10;
  int local_c;
  atomic<unsigned_long> *local_8;
  
  local_40 = in_R8;
  local_38 = in_RCX;
  local_30 = in_RDX;
  std::shared_ptr<nuraft::resp_msg>::shared_ptr
            ((shared_ptr<nuraft::resp_msg> *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
  local_58[0] = 0;
  std::shared_ptr<nuraft::buffer>::shared_ptr
            ((shared_ptr<nuraft::buffer> *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
  local_70 = 1;
  std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1ccf3c);
  local_78 = srv_state::get_term((srv_state *)0x1ccf44);
  std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
            ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x1ccf72);
  nuraft::context::get_params((context *)in_stack_fffffffffffffc08);
  local_ac = 4;
  cs_new<nuraft::resp_msg,unsigned_long&,nuraft::msg_type,int&,std::atomic<int>&>
            ((unsigned_long *)in_stack_fffffffffffffc08,(msg_type *)in_stack_fffffffffffffc00,
             (int *)in_stack_fffffffffffffbf8,(atomic<int> *)in_stack_fffffffffffffbf0);
  std::shared_ptr<nuraft::resp_msg>::operator=
            ((shared_ptr<nuraft::resp_msg> *)in_stack_fffffffffffffbf0,
             (shared_ptr<nuraft::resp_msg> *)in_stack_fffffffffffffbe8);
  std::shared_ptr<nuraft::resp_msg>::~shared_ptr((shared_ptr<nuraft::resp_msg> *)0x1ccfe3);
  sVar2 = std::atomic::operator_cast_to_srv_role((atomic<nuraft::srv_role> *)0x1ccff7);
  if ((sVar2 != leader) ||
     (bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffbf8), bVar1))
  {
    peVar4 = std::__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1cd023);
    resp_msg::set_result_code(peVar4,NOT_LEADER);
    std::shared_ptr<nuraft::resp_msg>::shared_ptr
              ((shared_ptr<nuraft::resp_msg> *)in_stack_fffffffffffffbf0,
               (shared_ptr<nuraft::resp_msg> *)in_stack_fffffffffffffbe8);
  }
  else if ((*(long *)(local_38 + 0x20) == 0) || (*(ulong *)(local_38 + 0x20) == local_78)) {
    local_b8 = req_msg::log_entries(local_30);
    local_c0 = std::
               vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ::size(local_b8);
    for (local_c8 = 0; local_c8 < local_c0; local_c8 = local_c8 + 1) {
      std::
      vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
      ::at((vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
            *)in_stack_fffffffffffffbf0,(size_type)in_stack_fffffffffffffbe8);
      peVar5 = std::__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1cd17b);
      log_entry::set_term(peVar5,local_78);
      std::
      vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
      ::at((vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
            *)in_stack_fffffffffffffbf0,(size_type)in_stack_fffffffffffffbe8);
      peVar5 = std::__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1cd1b9);
      log_entry::set_timestamp(peVar5,local_40);
      std::
      vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
      ::at((vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
            *)in_stack_fffffffffffffbf0,(size_type)in_stack_fffffffffffffbe8);
      local_d0 = store_log_entry(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,
                                 CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
      if (bVar1) {
        peVar6 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1cd24e);
        iVar3 = (*peVar6->_vptr_logger[7])();
        if (4 < iVar3) {
          peVar6 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1cd287);
          msg_if_given_abi_cxx11_
                    ((char *)local_f0,"append at log_idx %lu, timestamp %lu",local_d0,local_40);
          (*peVar6->_vptr_logger[8])
                    (peVar6,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_client_request.cxx"
                     ,"handle_cli_req",0x7b,local_f0);
          std::__cxx11::string::~string(local_f0);
        }
      }
      local_58[0] = local_d0;
      std::
      vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
      ::at((vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
            *)in_stack_fffffffffffffbf0,(size_type)in_stack_fffffffffffffbe8);
      std::__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x1cd35c);
      log_entry::get_buf_ptr(in_stack_fffffffffffffbe8);
      std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1cd37b);
      nuraft::buffer::pos((buffer *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                          (size_t)in_stack_fffffffffffffc08);
      peVar7 = std::
               __shared_ptr_access<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1cd39d);
      state_machine::ext_op_params::ext_op_params(&local_120,local_58[0],&local_100);
      (*peVar7->_vptr_state_machine[6])(local_110,peVar7,&local_120);
      std::shared_ptr<nuraft::buffer>::operator=
                ((shared_ptr<nuraft::buffer> *)in_stack_fffffffffffffbf0,
                 (shared_ptr<nuraft::buffer> *)in_stack_fffffffffffffbe8);
      std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x1cd409);
      bVar1 = std::function::operator_cast_to_bool
                        ((function<void_(const_nuraft::raft_server::req_ext_cb_params_&)> *)0x1cd416
                        );
      if (bVar1) {
        req_ext_cb_params::req_ext_cb_params(&local_138);
        local_138.log_idx = local_58[0];
        local_138.log_term = local_78;
        local_138.context = *(void **)(local_38 + 0x28);
        std::function<void_(const_nuraft::raft_server::req_ext_cb_params_&)>::operator()
                  ((function<void_(const_nuraft::raft_server::req_ext_cb_params_&)> *)
                   in_stack_fffffffffffffbf0,(req_ext_cb_params *)in_stack_fffffffffffffbe8);
      }
      std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x1cd4ae);
    }
    if (local_c0 != 0) {
      peVar8 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1cd4e6);
      (*peVar8->_vptr_log_store[7])(peVar8,local_58[0] - local_c0);
    }
    try_update_precommit_index
              (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
    peVar8 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1cd539);
    iVar3 = (*peVar8->_vptr_log_store[2])();
    local_70 = CONCAT44(extraout_var,iVar3);
    my_id = *(int32_t *)(in_RSI + 0x38);
    leader_id = std::__atomic_base::operator_cast_to_int
                          ((__atomic_base<int> *)in_stack_fffffffffffffbf8);
    __addr_len = (char *)0xffffffff;
    cb_func::Param::Param(&local_150,my_id,leader_id,-1,(void *)0x0);
    local_150.ctx = local_58;
    std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
              ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x1cd5c0);
    local_154 = cb_func::call((cb_func *)in_stack_fffffffffffffbf8,
                              (Type)((ulong)in_stack_fffffffffffffbf0 >> 0x20),
                              (Param *)in_stack_fffffffffffffbe8);
    if (local_154 == ReturnNull) {
      std::shared_ptr<nuraft::resp_msg>::shared_ptr
                ((shared_ptr<nuraft::resp_msg> *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8
                );
    }
    else {
      pdVar9 = debugging_options::get_instance();
      paVar10 = &pdVar9->handle_cli_req_sleep_us_;
      local_c = 0;
      local_8 = paVar10;
      local_10 = std::operator&(memory_order_relaxed,__memory_order_mask);
      if (local_c - 1U < 2) {
        local_18 = (paVar10->super___atomic_base<unsigned_long>)._M_i;
      }
      else if (local_c == 5) {
        local_18 = (paVar10->super___atomic_base<unsigned_long>)._M_i;
      }
      else {
        local_18 = (paVar10->super___atomic_base<unsigned_long>)._M_i;
      }
      local_160 = local_18;
      if (local_18 != 0) {
        timer_helper::sleep_us((size_t)in_stack_fffffffffffffbf0);
      }
      get_config(in_stack_fffffffffffffc08);
      this_00 = std::
                __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x1cd723);
      bVar1 = cluster_config::is_async_replication(this_00);
      std::shared_ptr<nuraft::cluster_config>::~shared_ptr
                ((shared_ptr<nuraft::cluster_config> *)0x1cd751);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
        if (bVar1) {
          peVar6 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1cdd81);
          iVar3 = (*peVar6->_vptr_logger[7])();
          if (4 < iVar3) {
            peVar6 = std::
                     __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1cddb4);
            uVar16 = local_58[0];
            peVar14 = std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::get(&local_68);
            msg_if_given_abi_cxx11_
                      ((char *)local_2e0,"asynchronously replicated %lu, return value %p",uVar16,
                       peVar14);
            __addr_len = "handle_cli_req";
            (*peVar6->_vptr_logger[8])
                      (peVar6,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_client_request.cxx"
                       ,"handle_cli_req",0xca,local_2e0);
            std::__cxx11::string::~string(local_2e0);
          }
        }
        in_stack_fffffffffffffbf0 =
             std::__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1cde66);
        std::shared_ptr<nuraft::buffer>::shared_ptr
                  ((shared_ptr<nuraft::buffer> *)in_stack_fffffffffffffbf0,
                   (shared_ptr<nuraft::buffer> *)in_stack_fffffffffffffbe8);
        resp_msg::set_ctx(in_stack_fffffffffffffbf0,(ptr<buffer> *)in_stack_fffffffffffffbe8);
        std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x1cdea3);
      }
      else {
        cs_new<nuraft::raft_server::commit_ret_elem>();
        uVar16 = local_58[0];
        peVar11 = std::
                  __shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1cd792);
        peVar11->idx_ = uVar16;
        peVar11 = std::
                  __shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1cd7a7);
        peVar11->result_code_ = TIMEOUT;
        std::lock_guard<std::mutex>::lock_guard
                  ((lock_guard<std::mutex> *)in_stack_fffffffffffffbf0,
                   (mutex_type *)in_stack_fffffffffffffbe8);
        local_190[0]._M_node =
             (_Base_ptr)
             std::
             map<unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>_>
             ::find((map<unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>_>
                     *)in_stack_fffffffffffffbe8,(key_type *)0x1cd7eb);
        local_198._M_node =
             (_Base_ptr)
             std::
             map<unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>_>
             ::end((map<unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>_>
                    *)in_stack_fffffffffffffbe8);
        bVar1 = std::operator!=(local_190,&local_198);
        if (bVar1) {
          std::
          _Rb_tree_iterator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
          ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
                        *)in_stack_fffffffffffffbf0);
          std::shared_ptr<nuraft::raft_server::commit_ret_elem>::operator=
                    ((shared_ptr<nuraft::raft_server::commit_ret_elem> *)in_stack_fffffffffffffbf0,
                     (shared_ptr<nuraft::raft_server::commit_ret_elem> *)in_stack_fffffffffffffbe8);
          bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
          if (bVar1) {
            peVar6 = std::
                     __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1cd88b);
            iVar3 = (*peVar6->_vptr_logger[7])();
            if (5 < iVar3) {
              peVar6 = std::
                       __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x1cd8be);
              peVar12 = std::
                        __shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>
                        ::get(local_180);
              msg_if_given_abi_cxx11_
                        ((char *)local_1b8,"commit thread was faster than this thread: %p",peVar12);
              (*peVar6->_vptr_logger[8])
                        (peVar6,6,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_client_request.cxx"
                         ,"handle_cli_req",0xaa,local_1b8);
              std::__cxx11::string::~string(local_1b8);
            }
          }
        }
        else {
          std::make_pair<unsigned_long&,std::shared_ptr<nuraft::raft_server::commit_ret_elem>&>
                    (&in_stack_fffffffffffffbf8->_M_f,
                     (shared_ptr<nuraft::raft_server::commit_ret_elem> *)in_stack_fffffffffffffbf0);
          std::
          map<unsigned_long,std::shared_ptr<nuraft::raft_server::commit_ret_elem>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<nuraft::raft_server::commit_ret_elem>>>>
          ::insert<std::pair<unsigned_long,std::shared_ptr<nuraft::raft_server::commit_ret_elem>>>
                    ((map<unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>_>
                      *)in_stack_fffffffffffffc00,
                     (pair<unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_> *)
                     in_stack_fffffffffffffbf8);
          std::pair<unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>::~pair
                    ((pair<unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_> *)
                     0x1cda22);
        }
        std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
                  ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x1cda5e);
        nuraft::context::get_params((context *)in_stack_fffffffffffffc08);
        peVar13 = std::
                  __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1cda82);
        rVar17 = peVar13->return_method_;
        std::shared_ptr<nuraft::raft_params>::~shared_ptr
                  ((shared_ptr<nuraft::raft_params> *)0x1cda93);
        if ((rVar17 == blocking) || (rVar17 != async_handler)) {
          std::__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1cdabb);
          __addr_len = (char *)local_180;
          std::
          bind<std::shared_ptr<nuraft::resp_msg>(nuraft::raft_server::*)(std::shared_ptr<nuraft::raft_server::commit_ret_elem>,std::shared_ptr<nuraft::resp_msg>),nuraft::raft_server*,std::shared_ptr<nuraft::raft_server::commit_ret_elem>&,std::_Placeholder<1>const&>
                    ((offset_in_raft_server_to_subr *)in_stack_fffffffffffffc08,
                     (raft_server **)in_stack_fffffffffffffc00,
                     (shared_ptr<nuraft::raft_server::commit_ret_elem> *)in_stack_fffffffffffffbf8,
                     (_Placeholder<1> *)in_stack_fffffffffffffbf0);
          std::function<std::shared_ptr<nuraft::resp_msg>(std::shared_ptr<nuraft::resp_msg>)>::
          function<std::_Bind<std::shared_ptr<nuraft::resp_msg>(nuraft::raft_server::*(nuraft::raft_server*,std::shared_ptr<nuraft::raft_server::commit_ret_elem>,std::_Placeholder<1>))(std::shared_ptr<nuraft::raft_server::commit_ret_elem>,std::shared_ptr<nuraft::resp_msg>)>,void>
                    (in_stack_fffffffffffffc00,
                     (_Bind<std::shared_ptr<nuraft::resp_msg>_(nuraft::raft_server::*(nuraft::raft_server_*,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::shared_ptr<nuraft::resp_msg>)>
                      *)in_stack_fffffffffffffbf8);
          resp_msg::set_cb(in_stack_fffffffffffffbf0,(resp_cb *)in_stack_fffffffffffffbe8);
          std::function<std::shared_ptr<nuraft::resp_msg>_(std::shared_ptr<nuraft::resp_msg>)>::
          ~function((function<std::shared_ptr<nuraft::resp_msg>_(std::shared_ptr<nuraft::resp_msg>)>
                     *)0x1cdb54);
          std::
          _Bind<std::shared_ptr<nuraft::resp_msg>_(nuraft::raft_server::*(nuraft::raft_server_*,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::shared_ptr<nuraft::resp_msg>)>
          ::~_Bind((_Bind<std::shared_ptr<nuraft::resp_msg>_(nuraft::raft_server::*(nuraft::raft_server_*,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::shared_ptr<nuraft::resp_msg>)>
                    *)0x1cdb61);
        }
        else {
          peVar11 = std::
                    __shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x1cdbbc);
          bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&peVar11->async_result_);
          if (!bVar1) {
            cs_new<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>
                      ();
            std::
            __shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1cdbeb);
            std::
            shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
            ::operator=((shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
                         *)in_stack_fffffffffffffbf0,
                        (shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
                         *)in_stack_fffffffffffffbe8);
            std::
            shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
            ::~shared_ptr((shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
                           *)0x1cdc0f);
          }
          std::__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1cdc1c);
          local_2b8 = handle_cli_req_callback_async;
          local_2b0 = 0;
          peVar11 = std::
                    __shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x1cdc5c);
          __addr_len = (char *)&peVar11->async_result_;
          std::
          bind<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>(nuraft::raft_server::*)(std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>),nuraft::raft_server*,std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>&>
                    (&in_stack_fffffffffffffbf8->_M_f,(raft_server **)in_stack_fffffffffffffbf0,
                     (shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
                      *)in_stack_fffffffffffffbe8);
          std::
          function<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>()>
          ::
          function<std::_Bind<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>(nuraft::raft_server::*(nuraft::raft_server*,std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>))(std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>)>,void>
                    ((function<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>_()>
                      *)in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
          resp_msg::set_async_cb
                    (in_stack_fffffffffffffbf0,(resp_async_cb *)in_stack_fffffffffffffbe8);
          std::
          function<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>_()>
          ::~function((function<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>_()>
                       *)0x1cdcbd);
          std::
          _Bind<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>_(nuraft::raft_server::*(nuraft::raft_server_*,_std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>))(std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>)>
          ::~_Bind((_Bind<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>_(nuraft::raft_server::*(nuraft::raft_server_*,_std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>))(std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>)>
                    *)0x1cdcca);
        }
        std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1cdd1f);
        std::shared_ptr<nuraft::raft_server::commit_ret_elem>::~shared_ptr
                  ((shared_ptr<nuraft::raft_server::commit_ret_elem> *)0x1cdd2c);
      }
      peVar4 = std::__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1cded5);
      resp_msg::accept(peVar4,(int)local_70,__addr,(socklen_t *)__addr_len);
      std::shared_ptr<nuraft::resp_msg>::shared_ptr
                ((shared_ptr<nuraft::resp_msg> *)in_stack_fffffffffffffbf0,
                 (shared_ptr<nuraft::resp_msg> *)in_stack_fffffffffffffbe8);
    }
  }
  else {
    peVar4 = std::__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1cd0bb);
    resp_msg::set_result_code(peVar4,TERM_MISMATCH);
    std::shared_ptr<nuraft::resp_msg>::shared_ptr
              ((shared_ptr<nuraft::resp_msg> *)in_stack_fffffffffffffbf0,
               (shared_ptr<nuraft::resp_msg> *)in_stack_fffffffffffffbe8);
  }
  local_b0 = 1;
  std::shared_ptr<nuraft::raft_params>::~shared_ptr((shared_ptr<nuraft::raft_params> *)0x1cdf14);
  std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x1cdf21);
  std::shared_ptr<nuraft::resp_msg>::~shared_ptr((shared_ptr<nuraft::resp_msg> *)0x1cdf2e);
  pVar15.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar15.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ptr<resp_msg>)pVar15.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_cli_req(req_msg& req,
                                          const req_ext_params& ext_params,
                                          uint64_t timestamp_us)
{
    ptr<resp_msg> resp = nullptr;
    ulong last_idx = 0;
    ptr<buffer> ret_value = nullptr;
    ulong resp_idx = 1;
    ulong cur_term = state_->get_term();
    ptr<raft_params> params = ctx_->get_params();

    resp = cs_new<resp_msg>( cur_term,
                             msg_type::append_entries_response,
                             id_,
                             leader_ );
    if (role_ != srv_role::leader || write_paused_) {
        resp->set_result_code( cmd_result_code::NOT_LEADER );
        return resp;
    }

    if (ext_params.expected_term_) {
        // If expected term is given, check the current term.
        if (ext_params.expected_term_ != cur_term) {
            resp->set_result_code( cmd_result_code::TERM_MISMATCH );
            return resp;
        }
    }

    std::vector< ptr<log_entry> >& entries = req.log_entries();
    size_t num_entries = entries.size();

    for (size_t i = 0; i < num_entries; ++i) {
        // force the log's term to current term
        entries.at(i)->set_term(cur_term);
        entries.at(i)->set_timestamp(timestamp_us);

        ulong next_slot = store_log_entry(entries.at(i));
        p_db("append at log_idx %" PRIu64 ", timestamp %" PRIu64,
             next_slot, timestamp_us);
        last_idx = next_slot;

        ptr<buffer> buf = entries.at(i)->get_buf_ptr();
        buf->pos(0);
        ret_value = state_machine_->pre_commit_ext
                    ( state_machine::ext_op_params( last_idx, buf ) );

        if (ext_params.after_precommit_) {
            req_ext_cb_params cb_params;
            cb_params.log_idx = last_idx;
            cb_params.log_term = cur_term;
            cb_params.context = ext_params.context_;
            ext_params.after_precommit_(cb_params);
        }
    }
    if (num_entries) {
        log_store_->end_of_append_batch(last_idx - num_entries, num_entries);
    }
    try_update_precommit_index(last_idx);
    resp_idx = log_store_->next_slot();

    // Finished appending logs and pre_commit of itself.
    cb_func::Param param(id_, leader_);
    param.ctx = &last_idx;
    CbReturnCode rc = ctx_->cb_func_.call(cb_func::AppendLogs, &param);
    if (rc == CbReturnCode::ReturnNull) return nullptr;

    size_t sleep_us = debugging_options::get_instance()
                      .handle_cli_req_sleep_us_.load(std::memory_order_relaxed);
    if (sleep_us) {
        // Sleep if the debugging option is given.
        timer_helper::sleep_us(sleep_us);
    }

    if (!get_config()->is_async_replication()) {
        // Sync replication:
        //   Set callback function for `last_idx`.
        ptr<commit_ret_elem> elem = cs_new<commit_ret_elem>();
        elem->idx_ = last_idx;
        elem->result_code_ = cmd_result_code::TIMEOUT;

        {   auto_lock(commit_ret_elems_lock_);
            auto entry = commit_ret_elems_.find(last_idx);
            if (entry != commit_ret_elems_.end()) {
                // Commit thread was faster than this.
                elem = entry->second;
                p_tr("commit thread was faster than this thread: %p", elem.get());
            } else {
                commit_ret_elems_.insert( std::make_pair(last_idx, elem) );
            }

            switch (ctx_->get_params()->return_method_) {
            case raft_params::blocking:
            default:
                // Blocking call: set callback function waiting for the result.
                resp->set_cb( std::bind( &raft_server::handle_cli_req_callback,
                                         this,
                                         elem,
                                         std::placeholders::_1 ) );
                break;

            case raft_params::async_handler:
                // Async handler: create & set async result object.
                if (!elem->async_result_) {
                    elem->async_result_ = cs_new< cmd_result< ptr<buffer> > >();
                }
                resp->set_async_cb
                      ( std::bind( &raft_server::handle_cli_req_callback_async,
                                   this,
                                   elem->async_result_ ) );
                break;
            }
        }

    } else {
        // Async replication:
        //   Immediately return with the result of pre-commit.
        p_dv( "asynchronously replicated %" PRIu64 ", return value %p",
              last_idx, ret_value.get() );
        resp->set_ctx(ret_value);
    }

    resp->accept(resp_idx);
    return resp;
}